

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void create_decl(c2m_ctx_t c2m_ctx,node_t_conflict scope,node_t_conflict decl_node,
                decl_spec decl_spec,node_t_conflict initializer,int param_p)

{
  type **type_ptr;
  node_code_t nVar1;
  check_ctx *pcVar2;
  node_t pnVar3;
  decl_spec dVar4;
  uint uVar5;
  int iVar6;
  decl_t decl;
  node_t_conflict r;
  type *ptVar7;
  decl_spec *decl_spec_00;
  node_t_conflict pnVar8;
  char *pcVar9;
  FILE *__stream;
  decl_t member_decl;
  node_code_t in_R9D;
  node_code_t nVar10;
  node_t_conflict id;
  bool bVar11;
  pos_t pVar12;
  
  nVar10 = decl_node->code;
  pcVar2 = c2m_ctx->check_ctx;
  decl = (decl_t)reg_malloc(c2m_ctx,0x60);
  uVar5 = decl_node->code - N_SPEC_DECL;
  if ((0x28 < uVar5) || ((0x10000800001U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
    __assert_fail("decl_node->code == N_MEMBER || decl_node->code == N_SPEC_DECL || decl_node->code == N_FUNC_DEF"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1ec9,
                  "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
  }
  init_decl(c2m_ctx,decl);
  decl->scope = scope;
  *(undefined4 *)&(decl->decl_spec).field_0x0 = decl_spec._0_4_;
  (decl->decl_spec).align = decl_spec.align;
  (decl->decl_spec).align_node = decl_spec.align_node;
  (decl->decl_spec).linkage = decl_spec.linkage;
  *(undefined4 *)&(decl->decl_spec).field_0x14 = decl_spec._20_4_;
  (decl->decl_spec).type = decl_spec.type;
  decl_node->attr = decl;
  r = DLIST_node_t_el(&(decl_node->u).ops,1);
  uVar5 = (uint)(nVar10 == N_FUNC_DEF);
  if (r->code == N_DECL) {
    ptVar7 = check_declarator(c2m_ctx,r,uVar5);
    ptVar7 = append_type(ptVar7,(decl->decl_spec).type);
    (decl->decl_spec).type = ptVar7;
  }
  else {
    if (r->code != N_IGNORE) {
      __assert_fail("declarator->code == N_DECL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1ed3,
                    "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
    }
    if (decl_node->code != N_MEMBER) {
      __assert_fail("decl_node->code == N_MEMBER",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1ed0,
                    "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
    }
    (decl->decl_spec).linkage = N_IGNORE;
    ptVar7 = (decl->decl_spec).type;
  }
  bVar11 = false;
  decl_spec_00 = &decl->decl_spec;
  check_type(c2m_ctx,ptVar7,0,uVar5);
  if (r->code == N_DECL) {
    id = (r->u).ops.head;
    if ((param_p == 0) && (pnVar3 = (((id->op_link).next)->u).ops.head, pnVar3 != (node_t)0x0)) {
      bVar11 = pnVar3->code == N_FUNC;
    }
    dVar4 = *decl_spec_00;
    pnVar8 = find_def(c2m_ctx,S_REGULAR,id,scope,(node_t_conflict *)0x0);
    nVar10 = N_IGNORE;
    if ((undefined1  [32])((undefined1  [32])dVar4 & (undefined1  [32])0x1) == (undefined1  [32])0x0
       ) {
      if (((undefined1  [32])((undefined1  [32])dVar4 & (undefined1  [32])0x4) ==
           (undefined1  [32])0x0) || (c2m_ctx->top_scope != scope)) {
        if (((undefined1  [32])((undefined1  [32])dVar4 & (undefined1  [32])0x2) ==
             (undefined1  [32])0x0) || (pnVar8 == (node_t_conflict)0x0)) {
          nVar10 = N_EXTERN;
          if ((undefined1  [32])((undefined1  [32])dVar4 & (undefined1  [32])0x2) ==
              (undefined1  [32])0x0) {
            if (((undefined1  [32])((undefined1  [32])dVar4 & (undefined1  [32])0x4) !=
                 (undefined1  [32])0x0) || ((!bVar11 && (c2m_ctx->top_scope != scope)))) {
LAB_001583ec:
              nVar10 = N_IGNORE;
            }
          }
          else if ((pnVar8 != (node_t_conflict)0x0) && (*(int *)((long)pnVar8->attr + 0x38) != 0))
          goto LAB_001583ec;
        }
        else {
          nVar1 = *(node_code_t *)((long)pnVar8->attr + 0x38);
          nVar10 = N_EXTERN;
          if (nVar1 != N_IGNORE) {
            nVar10 = nVar1;
          }
        }
      }
      else {
        nVar10 = N_STATIC;
      }
    }
    bVar11 = !bVar11;
    (decl->decl_spec).linkage = nVar10;
  }
  else {
    bVar11 = true;
    id = (node_t_conflict)0x0;
  }
  type_ptr = &(decl->decl_spec).type;
  if (decl_node->code != N_MEMBER) {
    set_type_layout(c2m_ctx,*type_ptr);
    check_decl_align(c2m_ctx,decl_spec_00);
    if ((((undefined1  [32])((undefined1  [32])*decl_spec_00 & (undefined1  [32])0x1) ==
          (undefined1  [32])0x0) && (decl->scope != c2m_ctx->top_scope)) &&
       (decl->scope->code != N_FUNC)) {
      VARR_decl_tpush(pcVar2->func_decls_for_allocation,decl);
    }
  }
  if (r->code == N_DECL) {
    def_symbol(c2m_ctx,(symbol_mode)id,scope,decl_node,
               (node_t_conflict)(ulong)(decl->decl_spec).linkage,in_R9D);
    if ((c2m_ctx->top_scope != scope) && ((decl->decl_spec).linkage == N_EXTERN)) {
      def_symbol(c2m_ctx,(symbol_mode)id,c2m_ctx->top_scope,decl_node,(node_t_conflict)&DAT_00000058
                 ,in_R9D);
    }
    if ((!bVar11) &&
       ((undefined1  [32])((undefined1  [32])*decl_spec_00 & (undefined1  [32])0x20) !=
        (undefined1  [32])0x0)) {
      pVar12 = get_node_pos(c2m_ctx,id);
      error(c2m_ctx,0x18cd5b,pVar12.fname,pVar12._8_8_);
      __stream = (FILE *)c2m_ctx->options->message_file;
      if (__stream != (FILE *)0x0) {
        if (id->code != N_IGNORE) {
          fprintf(__stream," of %s",(id->u).s.s);
          __stream = (FILE *)c2m_ctx->options->message_file;
        }
        fputc(10,__stream);
      }
    }
  }
  if ((initializer == (node_t_conflict)0x0) || (initializer->code == N_IGNORE)) {
    return;
  }
  ptVar7 = *type_ptr;
  iVar6 = incomplete_type_p(c2m_ctx,ptVar7);
  if (iVar6 == 0) {
LAB_001585ac:
    if (((decl->decl_spec).linkage == N_EXTERN) && (c2m_ctx->top_scope != scope)) {
      pVar12 = get_node_pos(c2m_ctx,initializer);
      error(c2m_ctx,0x18cdcf,pVar12.fname,pVar12._8_8_,(id->u).s.s);
      return;
    }
    member_decl = (decl_t)initializer;
    check(c2m_ctx,initializer,decl_node);
    if (((decl->decl_spec).linkage & ~N_I) == N_EXTERN) {
      uVar5 = 1;
    }
    else {
      uVar5 = 1;
      if ((*(byte *)decl_spec_00 & 0x20) == 0) {
        uVar5 = *(byte *)decl_spec_00 >> 2 & 1;
      }
    }
    check_initializer(c2m_ctx,member_decl,type_ptr,initializer,uVar5,1);
    return;
  }
  if (ptVar7->mode == TM_ARR) {
    ptVar7 = ((ptVar7->u).ptr_type)->arr_type;
    iVar6 = incomplete_type_p(c2m_ctx,ptVar7);
    if (iVar6 == 0) goto LAB_001585ac;
    if (ptVar7->mode == TM_ARR) {
      pVar12 = get_node_pos(c2m_ctx,initializer);
      pcVar9 = "initialization of incomplete sub-array";
      goto LAB_00158604;
    }
  }
  pVar12 = get_node_pos(c2m_ctx,initializer);
  pcVar9 = "initialization of incomplete type variable";
LAB_00158604:
  error(c2m_ctx,pcVar9,pVar12.fname,pVar12._8_8_);
  return;
}

Assistant:

static void create_decl (c2m_ctx_t c2m_ctx, node_t scope, node_t decl_node,
                         struct decl_spec decl_spec, node_t initializer, int param_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  int func_def_p = decl_node->code == N_FUNC_DEF, func_p = FALSE;
  node_t id = NULL; /* to remove an uninitialized warning */
  node_t list_head, declarator;
  struct type *type;
  decl_t decl = reg_malloc (c2m_ctx, sizeof (struct decl));

  assert (decl_node->code == N_MEMBER || decl_node->code == N_SPEC_DECL
          || decl_node->code == N_FUNC_DEF);
  init_decl (c2m_ctx, decl);
  decl->scope = scope;
  decl->decl_spec = decl_spec;
  decl_node->attr = decl;
  declarator = NL_EL (decl_node->u.ops, 1);
  if (declarator->code == N_IGNORE) {
    assert (decl_node->code == N_MEMBER);
    decl->decl_spec.linkage = N_IGNORE;
  } else {
    assert (declarator->code == N_DECL);
    type = check_declarator (c2m_ctx, declarator, func_def_p);
    decl->decl_spec.type = append_type (type, decl->decl_spec.type);
  }
  check_type (c2m_ctx, decl->decl_spec.type, 0, func_def_p);
  if (declarator->code == N_DECL) {
    id = NL_HEAD (declarator->u.ops);
    list_head = NL_HEAD (NL_NEXT (id)->u.ops);
    func_p = !param_p && list_head && list_head->code == N_FUNC;
    decl->decl_spec.linkage = get_id_linkage (c2m_ctx, func_p, id, scope, decl->decl_spec);
  }
  if (decl_node->code != N_MEMBER) {
    set_type_layout (c2m_ctx, decl->decl_spec.type);
    check_decl_align (c2m_ctx, &decl->decl_spec);
    if (!decl->decl_spec.typedef_p && decl->scope != top_scope && decl->scope->code != N_FUNC)
      VARR_PUSH (decl_t, func_decls_for_allocation, decl);
  }
  if (declarator->code == N_DECL) {
    def_symbol (c2m_ctx, S_REGULAR, id, scope, decl_node, decl->decl_spec.linkage);
    if (scope != top_scope && decl->decl_spec.linkage == N_EXTERN)
      def_symbol (c2m_ctx, S_REGULAR, id, top_scope, decl_node, N_EXTERN);
    if (func_p && decl->decl_spec.thread_local_p) {
      error (c2m_ctx, POS (id), "thread local function declaration");
      if (c2m_options->message_file != NULL) {
        if (id->code != N_IGNORE) fprintf (c2m_options->message_file, " of %s", id->u.s.s);
        fprintf (c2m_options->message_file, "\n");
      }
    }
  }
  if (initializer == NULL || initializer->code == N_IGNORE) return;
  if (incomplete_type_p (c2m_ctx, decl->decl_spec.type)
      && (decl->decl_spec.type->mode != TM_ARR
          || incomplete_type_p (c2m_ctx, decl->decl_spec.type->u.arr_type->el_type))) {
    if (decl->decl_spec.type->mode == TM_ARR
        && decl->decl_spec.type->u.arr_type->el_type->mode == TM_ARR)
      error (c2m_ctx, POS (initializer), "initialization of incomplete sub-array");
    else
      error (c2m_ctx, POS (initializer), "initialization of incomplete type variable");
    return;
  }
  if (decl->decl_spec.linkage == N_EXTERN && scope != top_scope) {
    error (c2m_ctx, POS (initializer), "initialization of %s in block scope with external linkage",
           id->u.s.s);
    return;
  }
  check (c2m_ctx, initializer, decl_node);
  check_initializer (c2m_ctx, NULL, &decl->decl_spec.type, initializer,
                     decl->decl_spec.linkage == N_STATIC || decl->decl_spec.linkage == N_EXTERN
                       || decl->decl_spec.thread_local_p || decl->decl_spec.static_p,
                     TRUE);
}